

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_00;
  auto_ptr<cmCompiledGeneratorExpression> this_01;
  bool bVar2;
  cmLocalGenerator *pcVar3;
  char *pcVar4;
  string *psVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  long lVar8;
  size_t sVar9;
  _Alloc_hider _Var10;
  char *pcVar11;
  string prepro;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string local_248;
  char *local_228;
  cmExportFileGenerator *local_220;
  string exportDirs;
  string dirs;
  string includes;
  ios_base local_158 [264];
  cmGeneratorExpression ge;
  
  local_220 = this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmExportFileGenerator.cxx"
                  ,0x16f,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  this_00 = tei->Target;
  paVar1 = &includes.field_2;
  includes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
  local_228 = cmGeneratorTarget::GetProperty(this_00,&includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != paVar1) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&includes);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&includes);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&includes);
  cmGeneratorExpression::Preprocess(&dirs,&tei->InterfaceIncludeDirectories,InstallInterface,true);
  (*local_220->_vptr_cmExportFileGenerator[0x11])(local_220,&dirs);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&includes,(string *)&ge);
  cge.x_ = (cmCompiledGeneratorExpression *)includes._M_dataplus;
  includes._M_dataplus._M_p = (pointer)0x0;
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&includes);
  this_01 = cge;
  pcVar3 = cmGeneratorTarget::GetLocalGenerator(this_00);
  includes._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&includes,"");
  prepro._M_dataplus._M_p = (pointer)&prepro.field_2;
  prepro._M_string_length = 0;
  prepro.field_2._M_local_buf[0] = '\0';
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     (this_01.x_,pcVar3,&includes,false,this_00,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&prepro);
  std::__cxx11::string::string((string *)&exportDirs,pcVar4,(allocator *)&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prepro._M_dataplus._M_p != &prepro.field_2) {
    operator_delete(prepro._M_dataplus._M_p,
                    CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                             prepro.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != paVar1) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
  if ((cge.x_)->HadContextSensitiveCondition == true) {
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(this_00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includes);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&includes,"Target \"",8);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&includes,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
               ,0xde);
    std::__cxx11::stringbuf::str();
    cmLocalGenerator::IssueMessage(pcVar3,FATAL_ERROR,&prepro);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includes);
    std::ios_base::~ios_base(local_158);
    goto LAB_0036862c;
  }
  if (local_228 == (char *)0x0) {
    if (exportDirs._M_string_length == 0) goto LAB_0036862c;
LAB_0036839e:
    includes._M_dataplus._M_p = (pointer)0x0;
    includes._M_string_length = 0;
    includes.field_2._M_allocated_capacity = 0;
    cmGeneratorExpression::Split
              (&exportDirs,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&includes);
    std::__cxx11::string::_M_replace
              ((ulong)&exportDirs,0,(char *)exportDirs._M_string_length,0x59497a);
    if (includes._M_dataplus._M_p != (pointer)includes._M_string_length) {
      _Var10 = includes._M_dataplus;
      do {
        std::__cxx11::string::append((char *)&exportDirs);
        bVar2 = cmsys::SystemTools::FileIsFullPath(*(char **)_Var10._M_p);
        if (!bVar2) {
          lVar8 = std::__cxx11::string::find(_Var10._M_p,0x576a88,0);
          if (lVar8 == -1) {
            std::__cxx11::string::append((char *)&exportDirs);
          }
        }
        std::__cxx11::string::_M_append((char *)&exportDirs,*(ulong *)_Var10._M_p);
        _Var10._M_p = _Var10._M_p + 0x20;
      } while (_Var10._M_p != (pointer)includes._M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&includes);
    pcVar4 = local_228;
    pcVar11 = local_228;
    if (local_228 == (char *)0x0) {
      pcVar11 = "";
    }
    includes._M_dataplus._M_p = (pointer)&includes.field_2;
    sVar9 = strlen(pcVar11);
    std::__cxx11::string::_M_construct<char_const*>((string *)&includes,pcVar11,pcVar11 + sVar9);
    pcVar11 = ";";
    if (pcVar4 == (char *)0x0) {
      pcVar11 = "";
    }
    std::operator+(&prepro,pcVar11,&exportDirs);
    std::__cxx11::string::_M_append((char *)&includes,(ulong)prepro._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
    cmGeneratorExpression::Preprocess(&prepro,&includes,InstallInterface,true);
    if (prepro._M_string_length != 0) {
      ResolveTargetsInGeneratorExpression(local_220,&prepro,this_00,missingTargets);
      paVar1 = &local_248.field_2;
      local_248._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,"INTERFACE_INCLUDE_DIRECTORIES","");
      bVar2 = checkInterfaceDirs(&prepro,this_00,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        local_248._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"INTERFACE_INCLUDE_DIRECTORIES","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,&local_248);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prepro._M_dataplus._M_p != &prepro.field_2) {
      operator_delete(prepro._M_dataplus._M_p,
                      CONCAT71(prepro.field_2._M_allocated_capacity._1_7_,
                               prepro.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    if ((*local_228 != '\0') || (exportDirs._M_string_length != 0)) goto LAB_0036839e;
    includes._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&includes,"INTERFACE_INCLUDE_DIRECTORIES","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&includes);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x59497a);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)includes._M_dataplus._M_p != &includes.field_2) {
    operator_delete(includes._M_dataplus._M_p,includes.field_2._M_allocated_capacity + 1);
  }
LAB_0036862c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exportDirs._M_dataplus._M_p != &exportDirs.field_2) {
    operator_delete(exportDirs._M_dataplus._M_p,exportDirs.field_2._M_allocated_capacity + 1);
  }
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dirs._M_dataplus._M_p != &dirs.field_2) {
    operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName] = "";
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}